

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void __thiscall
clip_model_loader::clip_model_loader(clip_model_loader *this,char *fname,clip_ctx *ctx_clip)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  undefined4 uVar5;
  pointer pgVar6;
  runtime_error *this_00;
  undefined8 uVar7;
  ulong uVar8;
  unique_ptr<ggml_context,_ggml_context_deleter> *puVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  long lVar13;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  size_t tensor_size;
  ggml_tensor *cur;
  ggml_type type;
  size_t offset;
  char *name_1;
  int i;
  string description;
  string name;
  int n_tensors;
  gguf_init_params params;
  ggml_context *meta;
  pointer in_stack_fffffffffffffd88;
  unique_ptr<ggml_context,_ggml_context_deleter> *in_stack_fffffffffffffd90;
  unique_ptr<gguf_context,_gguf_context_deleter> *in_stack_fffffffffffffda0;
  allocator<char> *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffe0c;
  undefined1 required;
  string *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  uint local_130;
  allocator<char> local_129;
  string local_128 [16];
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [32];
  string local_c0 [32];
  uint local_a0;
  undefined1 local_99;
  string local_98 [32];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined8 *puStack_70;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined8 *puStack_50;
  undefined8 local_48 [3];
  allocator<char> local_29;
  undefined8 local_28;
  undefined8 local_20;
  
  required = (undefined1)((uint)in_stack_fffffffffffffe0c >> 0x18);
  local_28 = in_RDX;
  local_20 = in_RSI;
  std::unique_ptr<ggml_context,ggml_context_deleter>::unique_ptr<ggml_context_deleter,void>
            (in_stack_fffffffffffffd90);
  std::unique_ptr<gguf_context,gguf_context_deleter>::unique_ptr<gguf_context_deleter,void>
            ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffd90);
  *(undefined8 *)(in_RDI + 0x10) = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  std::allocator<char>::~allocator(&local_29);
  local_48[0] = 0;
  local_58 = CONCAT31(local_58._1_3_,1);
  puStack_50 = local_48;
  local_78 = local_58;
  uStack_74 = uStack_54;
  puStack_70 = puStack_50;
  gguf_init_from_file(local_20,local_58,puStack_50);
  std::unique_ptr<gguf_context,gguf_context_deleter>::unique_ptr<gguf_context_deleter,void>
            ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffd90,
             (pointer)in_stack_fffffffffffffd88);
  std::unique_ptr<gguf_context,_gguf_context_deleter>::operator=
            ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffd90,
             (unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffd88);
  std::unique_ptr<gguf_context,_gguf_context_deleter>::~unique_ptr(in_stack_fffffffffffffda0);
  pgVar6 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                     ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffd90);
  if (pgVar6 == (pointer)0x0) {
    local_99 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    string_format_abi_cxx11_
              ((char *)local_98,"%s: failed to load CLIP model from %s. Does this file exist?\n",
               "clip_model_loader",local_20);
    std::runtime_error::runtime_error(this_00,local_98);
    local_99 = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::unique_ptr<ggml_context,_ggml_context_deleter>::reset
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  pgVar6 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                     ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffd90);
  local_a0 = gguf_get_n_tensors(pgVar6);
  std::__cxx11::string::string(local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  get_string((clip_model_loader *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,(bool)required);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::string(local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  get_string((clip_model_loader *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,(bool)required);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  if ((int)g_logger_state.verbosity_thold < 3) {
    uVar7 = std::__cxx11::string::c_str();
    clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: model name:   %s\n","clip_model_loader",uVar7);
  }
  if ((int)g_logger_state.verbosity_thold < 3) {
    uVar7 = std::__cxx11::string::c_str();
    clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: description:  %s\n","clip_model_loader",uVar7);
  }
  if ((int)g_logger_state.verbosity_thold < 3) {
    pgVar6 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffd90)
    ;
    uVar4 = gguf_get_version(pgVar6);
    clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: GGUF version: %d\n","clip_model_loader",(ulong)uVar4)
    ;
  }
  if ((int)g_logger_state.verbosity_thold < 3) {
    pgVar6 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffd90)
    ;
    uVar7 = gguf_get_alignment(pgVar6);
    clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: alignment:    %zu\n","clip_model_loader",uVar7);
  }
  if ((int)g_logger_state.verbosity_thold < 3) {
    clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_tensors:    %d\n","clip_model_loader",
                      (ulong)local_a0);
  }
  if ((int)g_logger_state.verbosity_thold < 3) {
    pgVar6 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffd90)
    ;
    uVar8 = gguf_get_n_kv(pgVar6);
    clip_log_internal(GGML_LOG_LEVEL_INFO,"%s: n_kv:         %d\n","clip_model_loader",
                      uVar8 & 0xffffffff);
  }
  if ((int)g_logger_state.verbosity_thold < 3) {
    clip_log_internal(GGML_LOG_LEVEL_INFO,"\n");
  }
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_c0);
  for (local_130 = 0; (int)local_130 < (int)local_a0; local_130 = local_130 + 1) {
    pgVar6 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffd90)
    ;
    uVar7 = gguf_get_tensor_name(pgVar6,(long)(int)local_130);
    pgVar6 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffd90)
    ;
    puVar9 = (unique_ptr<ggml_context,_ggml_context_deleter> *)
             gguf_get_tensor_offset(pgVar6,(long)(int)local_130);
    pgVar6 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_fffffffffffffd90)
    ;
    uVar5 = gguf_get_tensor_type(pgVar6,(long)(int)local_130);
    lVar10 = ggml_get_tensor(local_48[0],uVar7);
    lVar11 = ggml_nbytes(lVar10);
    *(long *)(in_RDI + 0x38) = lVar11 + *(long *)(in_RDI + 0x38);
    if ((int)g_logger_state.verbosity_thold < 2) {
      uVar4 = ggml_n_dims(lVar10);
      lVar13 = lVar10 + 0x100;
      uVar7 = *(undefined8 *)(lVar10 + 0x10);
      uVar1 = *(undefined8 *)(lVar10 + 0x18);
      uVar2 = *(undefined8 *)(lVar10 + 0x20);
      uVar3 = *(undefined8 *)(lVar10 + 0x28);
      uVar12 = ggml_type_name(uVar5);
      clip_log_internal(GGML_LOG_LEVEL_DEBUG,
                        "%s: tensor[%d]: n_dims = %d, name = %s, tensor_size=%zu, offset=%zu, shape:[%lu, %lu, %lu, %lu], type = %s\n"
                        ,"clip_model_loader",(ulong)local_130,(ulong)uVar4,lVar13,lVar11,puVar9,
                        uVar7,uVar1,uVar2,uVar3,uVar12);
      in_stack_fffffffffffffd90 = puVar9;
    }
  }
  return;
}

Assistant:

clip_model_loader(const char * fname, clip_ctx & ctx_clip) : ctx_clip(ctx_clip), fname(fname) {
        struct ggml_context * meta = nullptr;

        struct gguf_init_params params = {
            /*.no_alloc = */ true,
            /*.ctx      = */ &meta,
        };

        ctx_gguf = gguf_context_ptr(gguf_init_from_file(fname, params));
        if (!ctx_gguf.get()) {
            throw std::runtime_error(string_format("%s: failed to load CLIP model from %s. Does this file exist?\n", __func__, fname));
        }

        ctx_meta.reset(meta);

        const int n_tensors = gguf_get_n_tensors(ctx_gguf.get());

        // print gguf info
        {
            std::string name;
            get_string(KEY_NAME, name, false);
            std::string description;
            get_string(KEY_DESCRIPTION, description, false);
            LOG_INF("%s: model name:   %s\n",  __func__, name.c_str());
            LOG_INF("%s: description:  %s\n",  __func__, description.c_str());
            LOG_INF("%s: GGUF version: %d\n",  __func__, gguf_get_version(ctx_gguf.get()));
            LOG_INF("%s: alignment:    %zu\n", __func__, gguf_get_alignment(ctx_gguf.get()));
            LOG_INF("%s: n_tensors:    %d\n",  __func__, n_tensors);
            LOG_INF("%s: n_kv:         %d\n",  __func__, (int)gguf_get_n_kv(ctx_gguf.get()));
            LOG_INF("\n");
        }

        // tensors
        {
            for (int i = 0; i < n_tensors; ++i) {
                const char * name = gguf_get_tensor_name(ctx_gguf.get(), i);
                const size_t offset = gguf_get_tensor_offset(ctx_gguf.get(), i);
                enum ggml_type type = gguf_get_tensor_type(ctx_gguf.get(), i);
                struct ggml_tensor * cur = ggml_get_tensor(meta, name);
                size_t tensor_size = ggml_nbytes(cur);
                model_size += tensor_size;
                LOG_DBG("%s: tensor[%d]: n_dims = %d, name = %s, tensor_size=%zu, offset=%zu, shape:[%" PRIu64 ", %" PRIu64 ", %" PRIu64 ", %" PRIu64 "], type = %s\n",
                    __func__, i, ggml_n_dims(cur), cur->name, tensor_size, offset, cur->ne[0], cur->ne[1], cur->ne[2], cur->ne[3], ggml_type_name(type));
            }
        }
    }